

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGRegisterTypeLibrary
              (xmlChar *namespace,void *data,xmlRelaxNGTypeHave have,xmlRelaxNGTypeCheck check,
              xmlRelaxNGTypeCompare comp,xmlRelaxNGFacetCheck facet,xmlRelaxNGTypeFree freef)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  void *pvVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  undefined8 *__s;
  xmlChar *pxVar6;
  int ret;
  xmlRelaxNGTypeLibraryPtr lib;
  xmlRelaxNGFacetCheck facet_local;
  xmlRelaxNGTypeCompare comp_local;
  xmlRelaxNGTypeCheck check_local;
  xmlRelaxNGTypeHave have_local;
  void *data_local;
  xmlChar *namespace_local;
  
  if ((((xmlRelaxNGRegisteredTypes == (xmlHashTablePtr)0x0) || (namespace == (xmlChar *)0x0)) ||
      (check == (xmlRelaxNGTypeCheck)0x0)) || (comp == (xmlRelaxNGTypeCompare)0x0)) {
    namespace_local._4_4_ = -1;
  }
  else {
    pvVar3 = xmlHashLookup(xmlRelaxNGRegisteredTypes,namespace);
    if (pvVar3 == (void *)0x0) {
      __s = (undefined8 *)(*xmlMalloc)(0x38);
      if (__s == (undefined8 *)0x0) {
        xmlRngVErrMemory((xmlRelaxNGValidCtxtPtr)0x0,"adding types library\n");
        namespace_local._4_4_ = -1;
      }
      else {
        memset(__s,0,0x38);
        pxVar6 = xmlStrdup(namespace);
        *__s = pxVar6;
        __s[1] = data;
        __s[2] = have;
        __s[4] = comp;
        __s[3] = check;
        __s[5] = facet;
        __s[6] = freef;
        iVar2 = xmlHashAddEntry(xmlRelaxNGRegisteredTypes,namespace,__s);
        if (iVar2 < 0) {
          pp_Var4 = __xmlGenericError();
          p_Var1 = *pp_Var4;
          ppvVar5 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar5,"Relax-NG types library failed to register \'%s\'\n",namespace);
          xmlRelaxNGFreeTypeLibrary(__s,namespace);
          namespace_local._4_4_ = -1;
        }
        else {
          namespace_local._4_4_ = 0;
        }
      }
    }
    else {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Relax-NG types library \'%s\' already registered\n",namespace);
      namespace_local._4_4_ = -1;
    }
  }
  return namespace_local._4_4_;
}

Assistant:

static int
xmlRelaxNGRegisterTypeLibrary(const xmlChar * namespace, void *data,
                              xmlRelaxNGTypeHave have,
                              xmlRelaxNGTypeCheck check,
                              xmlRelaxNGTypeCompare comp,
                              xmlRelaxNGFacetCheck facet,
                              xmlRelaxNGTypeFree freef)
{
    xmlRelaxNGTypeLibraryPtr lib;
    int ret;

    if ((xmlRelaxNGRegisteredTypes == NULL) || (namespace == NULL) ||
        (check == NULL) || (comp == NULL))
        return (-1);
    if (xmlHashLookup(xmlRelaxNGRegisteredTypes, namespace) != NULL) {
        xmlGenericError(xmlGenericErrorContext,
                        "Relax-NG types library '%s' already registered\n",
                        namespace);
        return (-1);
    }
    lib =
        (xmlRelaxNGTypeLibraryPtr)
        xmlMalloc(sizeof(xmlRelaxNGTypeLibrary));
    if (lib == NULL) {
        xmlRngVErrMemory(NULL, "adding types library\n");
        return (-1);
    }
    memset(lib, 0, sizeof(xmlRelaxNGTypeLibrary));
    lib->namespace = xmlStrdup(namespace);
    lib->data = data;
    lib->have = have;
    lib->comp = comp;
    lib->check = check;
    lib->facet = facet;
    lib->freef = freef;
    ret = xmlHashAddEntry(xmlRelaxNGRegisteredTypes, namespace, lib);
    if (ret < 0) {
        xmlGenericError(xmlGenericErrorContext,
                        "Relax-NG types library failed to register '%s'\n",
                        namespace);
        xmlRelaxNGFreeTypeLibrary(lib, namespace);
        return (-1);
    }
    return (0);
}